

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFAcroFormDocumentHelper::disableDigitalSignatures(QPDFAcroFormDocumentHelper *this)

{
  bool bVar1;
  pointer this_00;
  vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> fields;
  QPDFObjectHandle oh;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> to_remove;
  string ft;
  allocator<char> local_d1;
  QPDFAcroFormDocumentHelper *local_d0;
  vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> local_c8;
  string local_b0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_90;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_80;
  string local_50;
  
  QPDF::removeSecurityRestrictions((this->super_QPDFDocumentHelper).qpdf);
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0 = this;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  getFormFields(&local_c8,this);
  for (this_00 = local_c8.
                 super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      local_c8.
      super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    QPDFFormFieldObjectHelper::getFieldType_abi_cxx11_(&local_50,this_00);
    bVar1 = std::operator==(&local_50,"/Sig");
    if (bVar1) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_90,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &(this_00->super_QPDFObjectHelper).super_BaseHandle);
      local_b0._M_dataplus._M_p =
           (pointer)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_90);
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::_M_insert_unique<QPDFObjGen>(&local_80,(QPDFObjGen *)&local_b0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"/FT",&local_d1);
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)&local_90,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"/V",&local_d1);
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)&local_90,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"/SV",&local_d1);
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)&local_90,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"/Lock",&local_d1);
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)&local_90,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  removeFormFields(local_d0,(set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                            &local_80);
  std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::~vector
            (&local_c8);
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&local_80);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::disableDigitalSignatures()
{
    qpdf.removeSecurityRestrictions();
    std::set<QPDFObjGen> to_remove;
    auto fields = getFormFields();
    for (auto& f: fields) {
        auto ft = f.getFieldType();
        if (ft == "/Sig") {
            auto oh = f.getObjectHandle();
            to_remove.insert(oh.getObjGen());
            // Make this no longer a form field. If it's also an annotation, the annotation will
            // survive. If it's only a field and is no longer referenced, it will disappear.
            oh.removeKey("/FT");
            // Remove fields that are specific to signature fields.
            oh.removeKey("/V");
            oh.removeKey("/SV");
            oh.removeKey("/Lock");
        }
    }
    removeFormFields(to_remove);
}